

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

TestCase * __thiscall testing::UnitTest::current_test_case(UnitTest *this)

{
  TestCase *pTVar1;
  long in_FS_OFFSET;
  UnitTest *this_local;
  MutexLock lock;
  
  lock.mutex_ = *(MutexBase **)(in_FS_OFFSET + 0x28);
  internal::GTestMutexLock::GTestMutexLock
            ((GTestMutexLock *)&this_local,&(this->mutex_).super_MutexBase);
  pTVar1 = internal::UnitTestImpl::current_test_case(this->impl_);
  internal::GTestMutexLock::~GTestMutexLock((GTestMutexLock *)&this_local);
  if (*(MutexBase **)(in_FS_OFFSET + 0x28) == lock.mutex_) {
    return pTVar1;
  }
  __stack_chk_fail();
}

Assistant:

GTEST_LOCK_EXCLUDED_(mutex_) {
  internal::MutexLock lock(&mutex_);
  return impl_->current_test_case();
}